

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O3

void __thiscall
geemuboi::test::core::CpuTest_ld_mbc_a_Test::~CpuTest_ld_mbc_a_Test(CpuTest_ld_mbc_a_Test *this)

{
  ICpu *pIVar1;
  
  (this->super_CpuTest).super_Test._vptr_Test = (_func_int **)&PTR__CpuTest_001acb40;
  pIVar1 = (this->super_CpuTest).cpu._M_t.
           super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
           _M_t.
           super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
           .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl;
  if (pIVar1 != (ICpu *)0x0) {
    (*pIVar1->_vptr_ICpu[3])();
  }
  (this->super_CpuTest).cpu._M_t.
  super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>._M_t.
  super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>.
  super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl = (ICpu *)0x0;
  (this->super_CpuTest).mmu.super_IMmu._vptr_IMmu = (_func_int **)&PTR_read_byte_001acb80;
  testing::internal::FunctionMockerBase<void_(unsigned_short,_unsigned_short)>::~FunctionMockerBase
            (&(this->super_CpuTest).mmu.gmock2_write_word_13.
              super_FunctionMockerBase<void_(unsigned_short,_unsigned_short)>);
  testing::internal::FunctionMockerBase<void_(unsigned_short,_unsigned_char)>::~FunctionMockerBase
            (&(this->super_CpuTest).mmu.gmock2_write_byte_12.
              super_FunctionMockerBase<void_(unsigned_short,_unsigned_char)>);
  testing::internal::FunctionMockerBase<unsigned_short_(unsigned_short)>::~FunctionMockerBase
            (&(this->super_CpuTest).mmu.gmock1_read_word_11.
              super_FunctionMockerBase<unsigned_short_(unsigned_short)>);
  testing::internal::FunctionMockerBase<unsigned_char_(unsigned_short)>::~FunctionMockerBase
            (&(this->super_CpuTest).mmu.gmock1_read_byte_10.
              super_FunctionMockerBase<unsigned_char_(unsigned_short)>);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, ld_mbc_a) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;

    regs.a = 0xFE;
    regs.b = 0x33;
    regs.c = 0x44;

    EXPECT_CALL(mmu, write_byte(make_addr(regs.b, regs.c), regs.a));
    execute_instruction(0x02);

    ICpu::Registers expected_regs{};
    expected_regs.a = 0xFE;
    expected_regs.b = 0x33;
    expected_regs.c = 0x44;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}